

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_shar.c
# Opt level: O1

int archive_write_set_format_shar(archive *_a)

{
  int iVar1;
  void *__s;
  int iVar2;
  
  iVar1 = __archive_check_magic(_a,0xb0c5c0de,1,"archive_write_set_format_shar");
  iVar2 = -0x1e;
  if (iVar1 != -0x1e) {
    if (*(code **)&_a[2].file_count != (code *)0x0) {
      (**(code **)&_a[2].file_count)(_a);
    }
    __s = malloc(0x90);
    if (__s == (void *)0x0) {
      archive_set_error(_a,0xc,"Can\'t allocate shar data");
    }
    else {
      iVar2 = 0;
      memset(__s,0,0x90);
      *(void **)&_a[1].current_codepage = __s;
      _a[1].sconv = (archive_string_conv *)0x4e4773;
      _a[2].archive_format_name = (char *)archive_write_shar_header;
      _a[2].compression_name = (char *)archive_write_shar_close;
      *(code **)&_a[2].file_count = archive_write_shar_free;
      *(code **)&_a[2].compression_code = archive_write_shar_data_sed;
      *(code **)&_a[2].archive_format = archive_write_shar_finish_entry;
      _a->archive_format = 0x20001;
      _a->archive_format_name = "shar";
    }
  }
  return iVar2;
}

Assistant:

int
archive_write_set_format_shar(struct archive *_a)
{
	struct archive_write *a = (struct archive_write *)_a;
	struct shar *shar;

	archive_check_magic(_a, ARCHIVE_WRITE_MAGIC,
	    ARCHIVE_STATE_NEW, "archive_write_set_format_shar");

	/* If someone else was already registered, unregister them. */
	if (a->format_free != NULL)
		(a->format_free)(a);

	shar = (struct shar *)malloc(sizeof(*shar));
	if (shar == NULL) {
		archive_set_error(&a->archive, ENOMEM, "Can't allocate shar data");
		return (ARCHIVE_FATAL);
	}
	memset(shar, 0, sizeof(*shar));
	archive_string_init(&shar->work);
	archive_string_init(&shar->quoted_name);
	a->format_data = shar;
	a->format_name = "shar";
	a->format_write_header = archive_write_shar_header;
	a->format_close = archive_write_shar_close;
	a->format_free = archive_write_shar_free;
	a->format_write_data = archive_write_shar_data_sed;
	a->format_finish_entry = archive_write_shar_finish_entry;
	a->archive.archive_format = ARCHIVE_FORMAT_SHAR_BASE;
	a->archive.archive_format_name = "shar";
	return (ARCHIVE_OK);
}